

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O0

void zzRedCrand_fast(word *a,word *mod,size_t n,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  word wVar5;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  dword prod;
  word carry;
  
  wVar5 = zzAddMulW(in_RDI,in_RDI + in_RDX,in_RDX,-*in_RSI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = wVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = -*in_RSI;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *in_RDI;
  auVar3 = auVar1 * auVar2 + auVar3;
  *in_RDI = auVar3._0_8_;
  wVar5 = zzAddW2(in_RDI + 1,in_RDX - 1,auVar3._8_8_);
  if ((wVar5 == 0) && (iVar4 = wwCmp(in_RDI,in_RSI,in_RDX), iVar4 < 0)) {
    return;
  }
  zzAddW2(in_RDI,in_RDX,-*in_RSI);
  return;
}

Assistant:

void FAST(zzRedCrand)(word a[], const word mod[], size_t n, void* stack)
{
	register word carry;
	register dword prod;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	// iter1
	carry = zzAddMulW(a, a + n, n, WORD_0 - mod[0]);
	// iter2
	zzMul11(prod, carry, WORD_0 - mod[0]);
	prod += a[0];
	a[0] = (word)prod;
	prod >>= B_PER_W;
	if (zzAddW2(a + 1, n - 1, (word)prod) || wwCmp(a, mod, n) >= 0)
		// correct
		zzAddW2(a, n, WORD_0 - mod[0]);
	// очистка
	prod = 0;
	carry = 0;
}